

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionGraph.cpp
# Opt level: O0

Instruction * __thiscall
Hpipe::InstructionGraph::make_boyer_moore_rec
          (InstructionGraph *this,
          Vec<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_> *front,
          InstructionNextChar *next_char,int orig_front_size)

{
  reference this_00;
  bool bVar1;
  reference c_00;
  iterator iVar2;
  InstructionMultiCond *this_01;
  pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*> *ppVar3;
  size_type sVar4;
  const_reference pvVar5;
  Instruction *inst;
  Vec<Hpipe::Transition> *this_02;
  Vec<unsigned_int> local_290;
  Transition local_278;
  Vec<unsigned_int> local_250;
  Transition local_238;
  Instruction *local_210;
  Instruction *next;
  Cond local_1f0;
  reference local_1d0;
  pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*> *p_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  Vec<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_> *__range2_1;
  Vec<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_> new_front;
  Cond *cond;
  iterator __end1_1;
  iterator __begin1_1;
  Vec<Hpipe::Cond> *__range1_1;
  InstructionMultiCond *res;
  Cond local_158;
  Cond local_138;
  undefined1 local_118 [8];
  Cond i_1;
  Cond i;
  Cond *c;
  iterator __end2;
  iterator __begin2;
  Vec<Hpipe::Cond> *__range2;
  Cond t;
  undefined1 local_88 [8];
  Vec<Hpipe::Cond> old_conds;
  pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*> *p;
  const_iterator __end1;
  const_iterator __begin1;
  Vec<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_> *__range1;
  Vec<Hpipe::Cond> conds;
  anon_class_8_1_a7eccd49 same_inst;
  int orig_front_size_local;
  InstructionNextChar *next_char_local;
  Vec<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_> *front_local;
  InstructionGraph *this_local;
  
  conds.super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
  super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)front;
  bVar1 = make_boyer_moore_rec::anon_class_8_1_a7eccd49::operator()
                    ((anon_class_8_1_a7eccd49 *)
                     &conds.super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
                      super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  if (bVar1) {
    ppVar3 = Vec<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_>::operator[](front,0);
    this_local = (InstructionGraph *)ppVar3->second;
  }
  else {
    Vec<Hpipe::Cond>::Vec((Vec<Hpipe::Cond> *)&__range1);
    __end1 = std::
             vector<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_>_>
             ::begin(&front->
                      super_vector<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_>_>
                    );
    p = (pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*> *)
        std::
        vector<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_>_>
        ::end(&front->
               super_vector<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_>_>
             );
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_*,_std::vector<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_>_>_>
                                       *)&p), bVar1) {
      old_conds.super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
      super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)__gnu_cxx::
                    __normal_iterator<const_std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_*,_std::vector<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_>_>_>
                    ::operator*(&__end1);
      Vec<Hpipe::Cond>::Vec((Vec<Hpipe::Cond> *)local_88,(Vec<Hpipe::Cond> *)&__range1);
      pvVar5 = std::vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>::back
                         ((vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_> *)
                          old_conds.super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
                          super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      Cond::Cond((Cond *)&__range2,pvVar5);
      std::vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>::clear
                ((vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_> *)&__range1);
      __end2 = std::vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>::begin
                         ((vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_> *)local_88);
      c = (Cond *)std::vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>::end
                            ((vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_> *)local_88);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<Hpipe::Cond_*,_std::vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>_>
                                         *)&c), bVar1) {
        c_00 = __gnu_cxx::
               __normal_iterator<Hpipe::Cond_*,_std::vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>_>
               ::operator*(&__end2);
        Cond::operator&((Cond *)(i_1.p.super__Base_bitset<4UL>._M_w + 3),(Cond *)&__range2,c_00);
        bVar1 = Cond::operator_cast_to_bool((Cond *)(i_1.p.super__Base_bitset<4UL>._M_w + 3));
        if (bVar1) {
          Vec<Hpipe::Cond>::operator<<
                    ((Vec<Hpipe::Cond> *)&__range1,(Cond *)(i_1.p.super__Base_bitset<4UL>._M_w + 3))
          ;
        }
        Cond::operator~(&local_138,(Cond *)&__range2);
        Cond::operator&((Cond *)local_118,&local_138,c_00);
        bVar1 = Cond::operator_cast_to_bool((Cond *)local_118);
        if (bVar1) {
          Vec<Hpipe::Cond>::operator<<((Vec<Hpipe::Cond> *)&__range1,(Cond *)local_118);
        }
        Cond::operator~(&local_158,c_00);
        Cond::operator&=((Cond *)&__range2,&local_158);
        __gnu_cxx::
        __normal_iterator<Hpipe::Cond_*,_std::vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>_>::
        operator++(&__end2);
      }
      bVar1 = Cond::operator_cast_to_bool((Cond *)&__range2);
      if (bVar1) {
        Vec<Hpipe::Cond>::operator<<((Vec<Hpipe::Cond> *)&__range1,(Cond *)&__range2);
      }
      Vec<Hpipe::Cond>::~Vec((Vec<Hpipe::Cond> *)local_88);
      __gnu_cxx::
      __normal_iterator<const_std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_*,_std::vector<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_>_>_>
      ::operator++(&__end1);
    }
    iVar2 = std::vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>::begin
                      ((vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_> *)&__range1);
    std::vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>::end
              ((vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_> *)&__range1);
    std::
    sort<__gnu_cxx::__normal_iterator<Hpipe::Cond*,std::vector<Hpipe::Cond,std::allocator<Hpipe::Cond>>>,Hpipe::InstructionGraph::make_boyer_moore_rec(Hpipe::Vec<std::pair<Hpipe::Vec<Hpipe::Cond>,Hpipe::Instruction*>>const&,Hpipe::InstructionNextChar*,int)::__1>
              (iVar2._M_current);
    this_01 = (InstructionMultiCond *)operator_new(0x198);
    ppVar3 = Vec<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_>::operator[](front,0);
    sVar4 = std::vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>::size
                      ((vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_> *)ppVar3);
    InstructionMultiCond::InstructionMultiCond
              (this_01,&(next_char->super_Instruction).cx,(Vec<Hpipe::Cond> *)&__range1,
               (int)sVar4 - orig_front_size);
    this_local = (InstructionGraph *)
                 PtrPool<Hpipe::Instruction,32>::operator<<
                           ((PtrPool<Hpipe::Instruction,32> *)&this->inst_pool,this_01);
    __end1_1 = std::vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>::begin
                         ((vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_> *)&__range1);
    cond = (Cond *)std::vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>::end
                             ((vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_> *)&__range1);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1_1,
                              (__normal_iterator<Hpipe::Cond_*,_std::vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>_>
                               *)&cond), bVar1) {
      new_front.
      super_vector<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_>_>
      .
      super__Vector_base<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)__gnu_cxx::
                    __normal_iterator<Hpipe::Cond_*,_std::vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>_>
                    ::operator*(&__end1_1);
      Vec<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_>::Vec
                ((Vec<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_> *)&__range2_1);
      __end2_1 = std::
                 vector<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_>_>
                 ::begin(&front->
                          super_vector<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_>_>
                        );
      p_1 = (pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*> *)
            std::
            vector<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_>_>
            ::end(&front->
                   super_vector<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_>_>
                 );
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<const_std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_*,_std::vector<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_>_>_>
                                 *)&p_1), bVar1) {
        local_1d0 = __gnu_cxx::
                    __normal_iterator<const_std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_*,_std::vector<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_>_>_>
                    ::operator*(&__end2_1);
        pvVar5 = std::vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>::back
                           ((vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_> *)local_1d0);
        Cond::operator&(&local_1f0,pvVar5,
                        (Cond *)new_front.
                                super_vector<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_>_>
                                .
                                super__Vector_base<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
        bVar1 = Cond::operator_cast_to_bool(&local_1f0);
        this_00 = local_1d0;
        if (bVar1) {
          sVar4 = std::vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>::size
                            ((vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_> *)local_1d0);
          Vec<Hpipe::Cond>::up_to((Vec<Hpipe::Cond> *)&next,&this_00->first,(int)sVar4 - 1);
          std::
          vector<std::pair<Hpipe::Vec<Hpipe::Cond>,Hpipe::Instruction*>,std::allocator<std::pair<Hpipe::Vec<Hpipe::Cond>,Hpipe::Instruction*>>>
          ::emplace_back<Hpipe::Vec<Hpipe::Cond>,Hpipe::Instruction*const&>
                    ((vector<std::pair<Hpipe::Vec<Hpipe::Cond>,Hpipe::Instruction*>,std::allocator<std::pair<Hpipe::Vec<Hpipe::Cond>,Hpipe::Instruction*>>>
                      *)&__range2_1,(Vec<Hpipe::Cond> *)&next,&local_1d0->second);
          Vec<Hpipe::Cond>::~Vec((Vec<Hpipe::Cond> *)&next);
        }
        __gnu_cxx::
        __normal_iterator<const_std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_*,_std::vector<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_>_>_>
        ::operator++(&__end2_1);
      }
      inst = make_boyer_moore_rec
                       (this,(Vec<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_> *)
                             &__range2_1,next_char,orig_front_size);
      local_210 = inst;
      Vec<unsigned_int>::Vec(&local_250);
      Transition::Transition(&local_238,inst,&local_250,-1.0);
      Vec<Hpipe::Transition>::operator<<((Vec<Hpipe::Transition> *)&this_local->init,&local_238);
      Transition::~Transition(&local_238);
      Vec<unsigned_int>::~Vec(&local_250);
      this_02 = &local_210->prev;
      Vec<unsigned_int>::Vec(&local_290);
      Transition::Transition(&local_278,(Instruction *)this_local,&local_290,-1.0);
      Vec<Hpipe::Transition>::operator<<(this_02,&local_278);
      Transition::~Transition(&local_278);
      Vec<unsigned_int>::~Vec(&local_290);
      Vec<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_>::~Vec
                ((Vec<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_> *)&__range2_1);
      __gnu_cxx::
      __normal_iterator<Hpipe::Cond_*,_std::vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>_>::
      operator++(&__end1_1);
    }
    Vec<Hpipe::Cond>::~Vec((Vec<Hpipe::Cond> *)&__range1);
  }
  return (Instruction *)this_local;
}

Assistant:

Instruction *InstructionGraph::make_boyer_moore_rec( const Vec<std::pair<Vec<Cond>, Instruction *> > &front, InstructionNextChar *next_char, int orig_front_size ) {
    //
    auto same_inst = [&]() {
        Instruction *f = front[ 0 ].second;
        for( unsigned i = 1; i < front.size(); ++i )
            if ( front[ i ].second != f )
                return false;
        return true;
    };
    if ( same_inst() )
        return front[ 0 ].second;

    // get the conds to test
    Vec<Cond> conds;
    for( const auto &p : front ) {
        Vec<Cond> old_conds = conds;
        Cond t = p.first.back();
        conds.clear();
        for( const Cond &c : old_conds ) {
            if ( Cond i = t & c )
                conds << i;
            if ( Cond i = ~t & c )
                conds << i;
            t &= ~c;
        }
        if ( t )
            conds << t;
    }
    std::sort( conds.begin(), conds.end(), []( const Cond &a, const Cond &b ) {
        return a.nz() < b.nz();
    } );

    //
    InstructionMultiCond *res = inst_pool << new InstructionMultiCond( next_char->cx, conds, front[ 0 ].first.size() - orig_front_size );
    for( const Cond &cond : conds ) {
        Vec<std::pair<Vec<Cond>, Instruction *> > new_front;
        for( const std::pair<Vec<Cond>, Instruction *> &p : front )
            if ( p.first.back() & cond )
                new_front.emplace_back( p.first.up_to( p.first.size() - 1 ), p.second );

        Instruction *next = make_boyer_moore_rec( new_front, next_char, orig_front_size );
        res->next << next;
        next->prev << res;
    }

    return res;

}